

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void tokenize(string *str,char *delim,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *vectorarg)

{
  value_type *in_RDX;
  char *in_RSI;
  string *in_RDI;
  size_type pos;
  size_type lastPos;
  string delimiters;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  value_type *__x;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar1;
  string local_88 [32];
  long local_68;
  long local_60;
  allocator local_41;
  string local_40 [32];
  value_type *local_20;
  string *local_8;
  
  local_20 = in_RDX;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60 = std::__cxx11::string::find_first_not_of(local_8,(ulong)local_40);
  local_68 = std::__cxx11::string::find_first_of(local_8,(ulong)local_40);
  while (uVar1 = local_68 != -1 || local_60 != -1, local_68 != -1 || local_60 != -1) {
    __x = local_20;
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(uVar1,in_stack_ffffffffffffff60),__x);
    std::__cxx11::string::~string(local_88);
    local_60 = std::__cxx11::string::find_first_not_of(local_8,(ulong)local_40);
    local_68 = std::__cxx11::string::find_first_of(local_8,(ulong)local_40);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void tokenize(const string& str, const char* delim, vector<string>* vectorarg)
{
    vector<string>& tokens = *vectorarg;
    
    string delimiters(delim);
    
    // skip delimiters at beginning.
    string::size_type lastPos = str.find_first_not_of( delimiters , 0);
    
    // find first "non-delimiter".
    string::size_type pos = str.find_first_of(delimiters, lastPos);
    
    while (string::npos != pos || string::npos != lastPos)
    {
        // found a token, add it to the vector.
        tokens.push_back(str.substr(lastPos, pos - lastPos));
        
        // skip delimiters.  Note the "not_of"
        lastPos = str.find_first_not_of(delimiters, pos);
        
        // find next "non-delimiter"
        pos = str.find_first_of(delimiters, lastPos);
    }
    
}